

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

bool __thiscall
glcts::TestCaseBase::setupFramebufferWithTextureAsAttachment
          (TestCaseBase *this,GLuint framebuffer_object_id,GLuint color_texture_id,
          GLenum texture_format,GLuint texture_width,GLuint texture_height)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(0xde1,color_texture_id);
  (**(code **)(lVar3 + 0x1380))(0xde1,1,texture_format,texture_width,texture_height);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not allocate texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x3ae);
  (**(code **)(lVar3 + 0x78))(0x8d40,framebuffer_object_id);
  (**(code **)(lVar3 + 0x6a0))(0x8ca9,0x8ce0,0xde1,color_texture_id,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not setup framebuffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x3b4);
  (**(code **)(lVar3 + 0x1a00))(0,0,texture_width,texture_height);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not setup viewport!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x3b9);
  return true;
}

Assistant:

bool TestCaseBase::setupFramebufferWithTextureAsAttachment(glw::GLuint framebuffer_object_id,
														   glw::GLuint color_texture_id, glw::GLenum texture_format,
														   glw::GLuint texture_width, glw::GLuint texture_height) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Allocate texture storage */
	gl.bindTexture(GL_TEXTURE_2D, color_texture_id);
	gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, texture_format, texture_width, texture_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not allocate texture storage!");

	/* Setup framebuffer */
	gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, color_texture_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not setup framebuffer!");

	/* Setup viewport */
	gl.viewport(0, 0, texture_width, texture_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not setup viewport!");

	/* Success */
	return true;
}